

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O3

uint8_t hex8_to_digest(char *data)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  
  bVar1 = *data;
  cVar3 = '0';
  if (((((char)bVar1 < ':') || (cVar3 = '7', bVar1 < 0x47)) || (cVar3 = 'W', bVar1 < 0x67)) &&
     (cVar3 <= (char)bVar1)) {
    cVar3 = (bVar1 - cVar3) * '\x10';
  }
  else {
    cVar3 = '\0';
  }
  bVar1 = data[1];
  cVar2 = '0';
  if (((((char)bVar1 < ':') || (cVar2 = '7', bVar1 < 0x47)) || (cVar2 = 'W', bVar1 < 0x67)) &&
     (cVar2 <= (char)bVar1)) {
    cVar2 = bVar1 - cVar2;
  }
  else {
    cVar2 = '\0';
  }
  return cVar2 + cVar3;
}

Assistant:

static uint8_t hex8_to_digest(const char data[2])
{
	return (hex4_to_digest(data[0]) * 16) + hex4_to_digest(data[1]);
}